

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDataCacheWrapper.cpp
# Opt level: O1

HRESULT __thiscall
Js::SimpleDataCacheWrapper::SeekReadStreamToBlockHelper
          (SimpleDataCacheWrapper *this,BlockType blockType,ULONG *bytesInBlock)

{
  int iVar1;
  
  iVar1 = 0;
  if ((this->inStream).ptr == (IStream *)0x0) {
    iVar1 = ReadHeader(this);
  }
  if (-1 < iVar1) {
    iVar1 = 0;
    if ((this->inStream).ptr == (IStream *)0x0) {
      iVar1 = ReadHeader(this);
    }
    if (((-1 < iVar1) && (iVar1 = -0x7fffbffb, blockType == BlockType_Invalid)) &&
       (iVar1 = 0, bytesInBlock != (ULONG *)0x0)) {
      *bytesInBlock = 0;
    }
  }
  return iVar1;
}

Assistant:

HRESULT SimpleDataCacheWrapper::SeekReadStreamToBlockHelper(_In_ BlockType blockType, _Out_opt_ ULONG* bytesInBlock)
    {
        HRESULT hr;
        BlockType currentBlockType = BlockType_Invalid;
        ULONG byteCount = 0;

        IFFAILRET(Read(&currentBlockType));
        IFFAILRET(Read(&byteCount));

        if (currentBlockType == blockType)
        {
            if (bytesInBlock != nullptr)
            {
                *bytesInBlock = byteCount;
            }
            return S_OK;
        }
        else if (currentBlockType == BlockType_Invalid || byteCount == 0)
        {
            return E_FAIL;
        }

#ifdef ENABLE_WININET_PROFILE_DATA_CACHE
        // The block we're pointing at is not the requested one, seek forward to the next block
        LARGE_INTEGER dlibMove;
        dlibMove.QuadPart = byteCount;
        IFFAILRET(this->inStream->Seek(dlibMove, STREAM_SEEK_CUR, nullptr));
#endif

        return SeekReadStreamToBlockHelper(blockType, bytesInBlock);
    }